

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O3

long __thiscall
tf::Serializer<std::ofstream,long>::operator()
          (Serializer<std::ofstream,long> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *items,TaskType *items_1
          ,time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
           *items_2,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *items_3)

{
  long lVar1;
  duration local_30;
  
  lVar1 = Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long>::
          _save<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_nullptr>
                    ((Serializer<std::basic_ofstream<char,_std::char_traits<char>_>,_long> *)this,
                     items);
  local_30.__r._0_4_ = *items_1;
  std::ostream::write(*(char **)this,(long)&local_30);
  local_30.__r = (items_2->__d).__r;
  std::ostream::write(*(char **)this,(long)&local_30);
  local_30.__r = (items_3->__d).__r;
  std::ostream::write(*(char **)this,(long)&local_30);
  return lVar1 + 0x14;
}

Assistant:

SizeType Serializer<Stream, SizeType>::operator() (T&&... items) {
  return (_save(std::forward<T>(items)) + ...);
}